

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qboxlayout.cpp
# Opt level: O1

bool __thiscall QBoxLayout::setStretchFactor(QBoxLayout *this,QWidget *widget,int stretch)

{
  long lVar1;
  QWidget *pQVar2;
  ulong uVar3;
  undefined8 *puVar4;
  bool bVar5;
  
  if (widget == (QWidget *)0x0) {
    bVar5 = false;
  }
  else {
    lVar1 = *(long *)&(this->super_QLayout).field_0x8;
    bVar5 = *(long *)(lVar1 + 0xc0) != 0;
    if (bVar5) {
      puVar4 = (undefined8 *)**(undefined8 **)(lVar1 + 0xb8);
      pQVar2 = (QWidget *)(**(code **)(*(long *)*puVar4 + 0x68))();
      if (pQVar2 != widget) {
        uVar3 = 1;
        do {
          bVar5 = uVar3 < *(ulong *)(lVar1 + 0xc0);
          if (*(ulong *)(lVar1 + 0xc0) <= uVar3) {
            return bVar5;
          }
          puVar4 = *(undefined8 **)(*(long *)(lVar1 + 0xb8) + uVar3 * 8);
          pQVar2 = (QWidget *)(**(code **)(*(long *)*puVar4 + 0x68))();
          uVar3 = uVar3 + 1;
        } while (pQVar2 != widget);
      }
      *(int *)(puVar4 + 1) = stretch;
      (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
    }
  }
  return bVar5;
}

Assistant:

bool QBoxLayout::setStretchFactor(QWidget *widget, int stretch)
{
    Q_D(QBoxLayout);
    if (!widget)
        return false;
    for (int i = 0; i < d->list.size(); ++i) {
        QBoxLayoutItem *box = d->list.at(i);
        if (box->item->widget() == widget) {
            box->stretch = stretch;
            invalidate();
            return true;
        }
    }
    return false;
}